

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathCalculator.cpp
# Opt level: O0

void __thiscall
tiger::trains::ai::PathCalculator::startInit
          (PathCalculator *this,LineBlocker *blocker,
          set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
          *setMinLen)

{
  bool bVar1;
  World *this_00;
  reference ppPVar2;
  mapped_type *pmVar3;
  mapped_type *ppPVar4;
  Point *pPVar5;
  __normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
  *in_RDI;
  map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
  *unaff_retaddr;
  Point *point;
  const_iterator __end1;
  const_iterator __begin1;
  vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_> *__range1;
  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  *in_stack_00000108;
  PathCalculator *in_stack_00000110;
  set<std::pair<int,_const_tiger::trains::world::Point_*>,_std::less<std::pair<int,_const_tiger::trains::world::Point_*>_>,_std::allocator<std::pair<int,_const_tiger::trains::world::Point_*>_>_>
  *in_stack_00000120;
  LineBlocker *in_stack_00000128;
  PathCalculator *in_stack_00000130;
  vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>
  *in_stack_ffffffffffffffb8;
  Train *in_stack_ffffffffffffffc8;
  __normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
  local_28;
  vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_> *local_20;
  __normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
  *__k;
  
  __k = in_RDI;
  this_00 = trains::world::Train::getWorld((Train *)in_RDI->_M_current);
  local_20 = trains::world::World::getPointList(this_00);
  local_28._M_current =
       (Point **)
       std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>::
       begin(in_stack_ffffffffffffffb8);
  std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>::end
            (in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
                               *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    ppPVar2 = __gnu_cxx::
              __normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
              ::operator*(&local_28);
    in_stack_ffffffffffffffc8 = (Train *)*ppPVar2;
    pmVar3 = std::
             map<const_tiger::trains::world::Point_*,_int,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_int>_>_>
             ::operator[](unaff_retaddr,(key_type *)__k);
    *pmVar3 = 0x7fffffff;
    ppPVar4 = std::
              map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
              ::operator[]((map<const_tiger::trains::world::Point_*,_const_tiger::trains::world::Point_*,_std::less<const_tiger::trains::world::Point_*>,_std::allocator<std::pair<const_tiger::trains::world::Point_*const,_const_tiger::trains::world::Point_*>_>_>
                            *)unaff_retaddr,(key_type *)__k);
    *ppPVar4 = (mapped_type)0x0;
    __gnu_cxx::
    __normal_iterator<tiger::trains::world::Point_*const_*,_std::vector<tiger::trains::world::Point_*,_std::allocator<tiger::trains::world::Point_*>_>_>
    ::operator++(&local_28);
  }
  pPVar5 = trains::world::Train::getPoint(in_stack_ffffffffffffffc8);
  if (pPVar5 == (Point *)0x0) {
    startOnLine(in_stack_00000110,in_stack_00000108);
  }
  else {
    startOnPoint(in_stack_00000130,in_stack_00000128,in_stack_00000120);
  }
  return;
}

Assistant:

void PathCalculator::startInit(LineBlocker &blocker,
                               std::set< std::pair<int, const world::Point *>> &setMinLen)
{
    for (auto point : train->getWorld()->getPointList())
    {
        minLen[point] = INT_MAX;
        ancestors[point] = nullptr;
    }

    if (train->getPoint() != nullptr)
        startOnPoint(blocker, setMinLen);
    else
        startOnLine(setMinLen);



}